

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

RPCHelpMan * wallet::listwalletdir(void)

{
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCExamples examples;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  initializer_list<RPCResult> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  undefined8 in_stack_fffffffffffffa88;
  undefined8 in_stack_fffffffffffffa90;
  undefined8 in_stack_fffffffffffffa98;
  undefined8 in_stack_fffffffffffffaa0;
  _Manager_type in_stack_fffffffffffffaa8;
  undefined8 in_stack_fffffffffffffab0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffffab8;
  pointer pRVar1;
  pointer pRVar2;
  pointer pRVar3;
  _Vector_impl_data in_stack_fffffffffffffae0;
  undefined1 in_stack_fffffffffffffaf8 [24];
  pointer in_stack_fffffffffffffb10;
  RPCMethodImpl in_stack_fffffffffffffb18;
  allocator<char> local_4b2;
  allocator<char> local_4b1;
  RPCResults local_4b0;
  vector<RPCArg,_std::allocator<RPCArg>_> local_498;
  allocator<char> local_472;
  allocator<char> local_471;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  char *local_390;
  size_type local_388;
  char local_380 [8];
  undefined8 uStack_378;
  string local_370 [32];
  string local_350 [32];
  RPCResult local_330;
  string local_2a8 [32];
  string local_288 [32];
  RPCResult local_268;
  string local_1e0 [32];
  string local_1c0 [32];
  RPCResult local_1a0;
  string local_118 [32];
  string local_f8 [32];
  RPCResult local_d8;
  string local_50 [32];
  string local_30 [32];
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>(local_30,"listwalletdir",&local_471);
  std::__cxx11::string::string<std::allocator<char>>
            (local_50,"Returns a list of wallets in the wallet directory.\n",&local_472);
  local_498.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_498.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_498.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>(local_f8,"",&local_4b1);
  std::__cxx11::string::string<std::allocator<char>>(local_118,"",&local_4b2);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1c0,"wallets",(allocator<char> *)&stack0xfffffffffffffb2f);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1e0,"",(allocator<char> *)&stack0xfffffffffffffb2e);
  std::__cxx11::string::string<std::allocator<char>>
            (local_288,"",(allocator<char> *)&stack0xfffffffffffffb0f);
  std::__cxx11::string::string<std::allocator<char>>
            (local_2a8,"",(allocator<char> *)&stack0xfffffffffffffb0e);
  std::__cxx11::string::string<std::allocator<char>>
            (local_350,"name",(allocator<char> *)&stack0xfffffffffffffaef);
  std::__cxx11::string::string<std::allocator<char>>
            (local_370,"The wallet name",(allocator<char> *)&stack0xfffffffffffffaee);
  pRVar1 = (pointer)0x0;
  pRVar2 = (pointer)0x0;
  pRVar3 = (pointer)0x0;
  m_key_name._M_string_length = in_stack_fffffffffffffa90;
  m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa88;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffffa98;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffffaa0;
  description._M_string_length = in_stack_fffffffffffffab0;
  description._M_dataplus._M_p = (pointer)in_stack_fffffffffffffaa8;
  description.field_2 = in_stack_fffffffffffffab8;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  RPCResult::RPCResult(&local_330,STR,m_key_name,description,inner,SUB81(local_350,0));
  __l._M_len = 1;
  __l._M_array = &local_330;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffaf0,__l,
             (allocator_type *)&stack0xfffffffffffffac7);
  m_key_name_00._M_string_length = in_stack_fffffffffffffa90;
  m_key_name_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa88;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_fffffffffffffa98;
  m_key_name_00.field_2._8_8_ = in_stack_fffffffffffffaa0;
  description_00._M_string_length = in_stack_fffffffffffffab0;
  description_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffaa8;
  description_00.field_2._M_local_buf = in_stack_fffffffffffffab8._M_local_buf;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar2;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar1;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar3;
  RPCResult::RPCResult(&local_268,OBJ,m_key_name_00,description_00,inner_00,SUB81(local_288,0));
  __l_00._M_len = 1;
  __l_00._M_array = &local_268;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffb10,__l_00,
             (allocator_type *)&stack0xfffffffffffffac6);
  m_key_name_01._M_string_length = in_stack_fffffffffffffa90;
  m_key_name_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa88;
  m_key_name_01.field_2._M_allocated_capacity = in_stack_fffffffffffffa98;
  m_key_name_01.field_2._8_8_ = in_stack_fffffffffffffaa0;
  description_01._M_string_length = in_stack_fffffffffffffab0;
  description_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffffaa8;
  description_01.field_2._M_local_buf = in_stack_fffffffffffffab8._M_local_buf;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar2;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar1;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar3;
  RPCResult::RPCResult(&local_1a0,ARR,m_key_name_01,description_01,inner_01,SUB81(local_1c0,0));
  __l_01._M_len = 1;
  __l_01._M_array = &local_1a0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffb30,__l_01,
             (allocator_type *)&stack0xfffffffffffffac5);
  m_key_name_02._M_string_length = in_stack_fffffffffffffa90;
  m_key_name_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa88;
  m_key_name_02.field_2._M_allocated_capacity = in_stack_fffffffffffffa98;
  m_key_name_02.field_2._8_8_ = in_stack_fffffffffffffaa0;
  description_02._M_string_length = in_stack_fffffffffffffab0;
  description_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffffaa8;
  description_02.field_2 = in_stack_fffffffffffffab8;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar2;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar1;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar3;
  RPCResult::RPCResult(&local_d8,OBJ,m_key_name_02,description_02,inner_02,SUB81(local_f8,0));
  result.m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa90;
  result._0_8_ = in_stack_fffffffffffffa88;
  result.m_key_name._M_string_length = in_stack_fffffffffffffa98;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffffaa0;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffffaa8;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffab0;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_fffffffffffffab8;
  result._64_8_ = pRVar1;
  result.m_description._M_dataplus._M_p = (pointer)pRVar2;
  result.m_description._M_string_length = (size_type)pRVar3;
  result._88_24_ = in_stack_fffffffffffffae0;
  result.m_cond._M_string_length = in_stack_fffffffffffffaf8._0_8_;
  result.m_cond.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_fffffffffffffaf8._8_16_;
  RPCResults::RPCResults(&local_4b0,result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3f0,"listwalletdir",(allocator<char> *)&stack0xfffffffffffffac4);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_410,"",(allocator<char> *)&stack0xfffffffffffffac3);
  HelpExampleCli(&local_3d0,&local_3f0,&local_410);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_450,"listwalletdir",(allocator<char> *)&stack0xfffffffffffffac2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_470,"",(allocator<char> *)&stack0xfffffffffffffac1);
  HelpExampleRpc(&local_430,&local_450,&local_470);
  std::operator+(&local_3b0,&local_3d0,&local_430);
  local_390 = local_380;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p == &local_3b0.field_2) {
    uStack_378 = local_3b0.field_2._8_8_;
  }
  else {
    local_390 = local_3b0._M_dataplus._M_p;
  }
  local_388 = local_3b0._M_string_length;
  local_3b0._M_string_length = 0;
  local_3b0.field_2._M_local_buf[0] = '\0';
  description_03._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/rpc/wallet.cpp:169:9)>
       ::_M_invoke;
  description_03._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/rpc/wallet.cpp:169:9)>
                ::_M_manager;
  description_03.field_2 = in_stack_fffffffffffffab8;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar2;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar1;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar3;
  examples.m_examples.field_2._8_8_ = in_stack_fffffffffffffb10;
  examples.m_examples._0_24_ = in_stack_fffffffffffffaf8;
  local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_stack_fffffffffffffa90,&stack0xfffffffffffffa98)),
             description_03,args,(RPCResults)in_stack_fffffffffffffae0,examples,
             in_stack_fffffffffffffb18);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffffa98);
  std::__cxx11::string::~string((string *)&local_390);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::~string((string *)&local_470);
  std::__cxx11::string::~string((string *)&local_450);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_4b0.m_results);
  RPCResult::~RPCResult(&local_d8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffb30);
  RPCResult::~RPCResult(&local_1a0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffb10);
  RPCResult::~RPCResult(&local_268);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffaf0);
  RPCResult::~RPCResult(&local_330);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffac8);
  std::__cxx11::string::~string(local_370);
  std::__cxx11::string::~string(local_350);
  std::__cxx11::string::~string(local_2a8);
  std::__cxx11::string::~string(local_288);
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::string::~string(local_118);
  std::__cxx11::string::~string(local_f8);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_498);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan listwalletdir()
{
    return RPCHelpMan{"listwalletdir",
                "Returns a list of wallets in the wallet directory.\n",
                {},
                RPCResult{
                    RPCResult::Type::OBJ, "", "",
                    {
                        {RPCResult::Type::ARR, "wallets", "",
                        {
                            {RPCResult::Type::OBJ, "", "",
                            {
                                {RPCResult::Type::STR, "name", "The wallet name"},
                            }},
                        }},
                    }
                },
                RPCExamples{
                    HelpExampleCli("listwalletdir", "")
            + HelpExampleRpc("listwalletdir", "")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    UniValue wallets(UniValue::VARR);
    for (const auto& [path, _] : ListDatabases(GetWalletDir())) {
        UniValue wallet(UniValue::VOBJ);
        wallet.pushKV("name", path.utf8string());
        wallets.push_back(std::move(wallet));
    }

    UniValue result(UniValue::VOBJ);
    result.pushKV("wallets", std::move(wallets));
    return result;
},
    };
}